

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodeproj.cc
# Opt level: O0

RC __thiscall QL_NodeProj::PrintNode(QL_NodeProj *this,int numTabs)

{
  int iVar1;
  ostream *poVar2;
  int local_1c;
  int index;
  int i_1;
  int i;
  int numTabs_local;
  QL_NodeProj *this_local;
  
  for (index = 0; index < numTabs; index = index + 1) {
    std::operator<<((ostream *)&std::cout,"\t");
  }
  std::operator<<((ostream *)&std::cout,"--PROJ: \n");
  for (local_1c = 0; local_1c < (this->super_QL_Node).attrsInRecSize; local_1c = local_1c + 1) {
    iVar1 = (this->super_QL_Node).attrsInRec[local_1c];
    poVar2 = std::operator<<((ostream *)&std::cout," ");
    poVar2 = std::operator<<(poVar2,((this->super_QL_Node).qlm)->attrEntries[iVar1].relName);
    poVar2 = std::operator<<(poVar2,".");
    std::operator<<(poVar2,((this->super_QL_Node).qlm)->attrEntries[iVar1].attrName);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  (*this->prevNode->_vptr_QL_Node[5])(this->prevNode,(ulong)(numTabs + 1));
  return 0;
}

Assistant:

RC QL_NodeProj::PrintNode(int numTabs){
  for(int i=0; i < numTabs; i++){
    cout << "\t";
  }
  cout << "--PROJ: \n";
  for(int i = 0; i < attrsInRecSize; i++){
    int index = attrsInRec[i];
    cout << " " << qlm.attrEntries[index].relName << "." << qlm.attrEntries[index].attrName;
  }
  cout << "\n";
  prevNode.PrintNode(numTabs + 1);

  return (0);
}